

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r6p_1lin.cpp
# Opt level: O2

int r6pSingleLin(MatrixXd *X,MatrixXd *u,MatrixXd *ud,int direction,double r0,int maxpow,
                RSSinglelinCameraPoseVector *results)

{
  double *udata;
  double *ud_00;
  int nroots_00;
  undefined4 uVar1;
  CommaInitializer<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *this;
  long lVar2;
  int *piVar3;
  double *pdVar4;
  int j_1;
  int j_2;
  long lVar5;
  long lVar6;
  int j;
  double dVar7;
  long lVar8;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar9;
  int nroots;
  MatrixXd RR;
  VectorXd wCt;
  VectorXd b;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> local_57e0;
  undefined1 local_57a8 [16];
  MatrixXd *local_5798;
  MatrixXd CC;
  MatrixXd AM;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_575b [3];
  Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> data;
  MatrixXd A;
  undefined1 local_5720 [8];
  RSSinglelinCameraPose *local_5718;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *local_5710;
  PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *local_5708;
  undefined8 local_5700;
  Index local_56f0;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  v;
  VectorXd coeffs;
  MatrixXd alpha;
  Vector4d q;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *local_5678;
  undefined8 *local_5670;
  Vector3d local_5668;
  Vector3d local_5650;
  undefined8 local_5638;
  undefined8 local_5630;
  undefined8 local_5628;
  DenseStorage<double,__1,__1,__1,_0> local_5620;
  DenseStorage<double,__1,__1,__1,_0> local_5608;
  MatrixXd C0;
  RSSinglelinCameraPose *local_55d8;
  VectorXd *local_55d0;
  PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *local_55c0;
  undefined8 local_55b8;
  Index local_55a8;
  Vector3d eax;
  MatrixXcd sols;
  MatrixXd C1;
  DenseStorage<double,__1,__1,_1,_0> local_5548;
  Vector4d local_5538;
  AngleAxis<double> eaxn;
  Matrix<double,_3,_9,_0,_3,_9> temp;
  Vector3d local_5418;
  MatrixXd local_5400;
  double p [65];
  double proots [65];
  Matrix3d R;
  double roots [64];
  double solver_input [2475];
  
  solver_input[0] = (double)CONCAT44(solver_input[0]._4_4_,0x4ec);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&coeffs,(int *)solver_input);
  solver_input[0] = 4.89124989382834e-322;
  solver_input[1] = 8.05327002721232e-322;
  solver_input[2] = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&CC,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)solver_input);
  v.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  v.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  v.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pdVar4 = (X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  udata = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  ud_00 = (ud->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  local_57a8._0_4_ = direction;
  local_5798 = X;
  if (direction == 0) {
    R6P_cayley_linearized_prepare_data_C(pdVar4,udata,ud_00,r0,solver_input);
  }
  else {
    R6P_cayley_linearized_prepare_data_y_C(pdVar4,udata,ud_00,r0,solver_input);
  }
  data.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_rows.m_value = 0xf;
  data.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_cols.m_value = 0xa5;
  lVar2 = 0;
  data.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)solver_input;
  for (dVar7 = 0.0; dVar7 != 7.4109846876187e-323; dVar7 = (double)((long)dVar7 + 1)) {
    p[0] = (double)((long)data.
                          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                          .
                          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                          .m_data + lVar2);
    p[5] = (double)data.
                   super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                   .
                   super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                   .m_cols.m_value;
    p[3] = (double)data.
                   super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                   .
                   super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                   .m_data;
    p[4] = (double)data.
                   super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                   .
                   super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                   .m_rows.m_value;
    p[2] = (double)data.
                   super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                   .
                   super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                   .m_cols.m_value;
    p[8] = 0.0;
    p[9] = 4.94065645841247e-324;
    p[7] = dVar7;
    roots[0] = Eigen::
               DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Block<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1,_-1,_false>_>_>
               ::mean((DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_false>_>_>
                       *)p);
    proots[0] = (double)((long)data.
                               super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                               .
                               super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                               .m_data + lVar2);
    proots[2] = (double)data.
                        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                        .
                        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                        .m_cols.m_value;
    proots[5] = (double)data.
                        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                        .
                        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                        .m_cols.m_value;
    proots[3] = (double)data.
                        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                        .
                        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                        .m_data;
    proots[4] = (double)data.
                        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                        .
                        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                        .m_rows.m_value;
    proots[8] = 0.0;
    proots[9] = 4.94065645841247e-324;
    proots[7] = dVar7;
    Eigen::
    DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1,_-1,_false>_>
    ::operator/=((DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_false>_>
                  *)proots,roots);
    lVar2 = lVar2 + 8;
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_5400,
             (DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
              *)&data);
  computeCoeffs(&local_5400,&coeffs);
  free(local_5400.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data)
  ;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            (&local_5548,(DenseStorage<double,__1,__1,_1,_0> *)&coeffs);
  setupEliminationTemplate((VectorXd *)&local_5548,&CC);
  free(local_5548.m_data);
  p[0] = (double)CC.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                 m_data;
  p[1] = (double)CC.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                 m_rows;
  p[2] = 4.89124989382834e-322;
  p[4] = 0.0;
  p[5] = 0.0;
  p[6] = (double)CC.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                 m_rows;
  p[3] = (double)&CC;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,true>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&C0,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>_> *)p);
  p[5] = (double)(CC.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                  m_cols + -0x40);
  p[0] = (double)(CC.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                  m_data + CC.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage.m_rows * (long)p[5]);
  p[1] = (double)CC.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                 m_rows;
  p[2] = 3.16202013338398e-322;
  p[4] = 0.0;
  p[6] = (double)CC.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                 m_rows;
  p[3] = (double)&CC;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,true>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&C1,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>_> *)p);
  Eigen::PartialPivLU<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PartialPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((PartialPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)p,
             (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&C0);
  proots[0] = (double)p;
  proots[1] = (double)&C1;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Solve<Eigen::PartialPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&alpha,
             (DenseBase<Eigen::Solve<Eigen::PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)proots);
  Eigen::PartialPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~PartialPivLU
            ((PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)p);
  p[0] = (double)CONCAT44(p[0]._4_4_,0x55);
  proots[0] = (double)CONCAT44(proots[0]._4_4_,0x40);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&RR,(int *)p,(int *)proots);
  dVar7 = 0.0;
  for (lVar2 = 0; lVar2 != 0xa8; lVar2 = lVar2 + 8) {
    p[4] = (double)((long)dVar7 + 0x4e);
    p[0] = (double)((long)alpha.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                          m_storage.m_data + lVar2 + 0x270);
    p[2] = (double)alpha.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                   m_cols;
    p[5] = 0.0;
    p[6] = 4.94065645841247e-324;
    proots[0] = (double)((long)RR.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                               m_storage.m_data + lVar2);
    proots[2] = (double)RR.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_cols;
    proots[3] = (double)&RR;
    proots[5] = 0.0;
    proots[6] = 4.94065645841247e-324;
    p[3] = (double)&alpha;
    proots[4] = dVar7;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>const>>
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)proots,
               (CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                *)p);
    dVar7 = (double)((long)dVar7 + 1);
  }
  lVar2 = 0x40;
  proots[0] = 3.16202013338398e-322;
  proots[1] = 3.16202013338398e-322;
  p[4] = (double)(RR.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                  m_rows + -0x40);
  p[0] = (double)(RR.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                  m_data + RR.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage.m_rows + -0x40);
  p[1] = 3.16202013338398e-322;
  p[2] = (double)RR.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                 m_cols;
  p[3] = (double)&RR;
  p[5] = 0.0;
  p[6] = (double)RR.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                 m_rows;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)p,
             (CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
              *)proots);
  p[0] = (double)CONCAT44(p[0]._4_4_,0x40);
  proots[0] = (double)CONCAT44(proots[0]._4_4_,0x40);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&AM,(int *)p,(int *)proots);
  piVar3 = &DAT_005f4ad0;
  lVar8 = 0;
  for (dVar7 = 0.0; dVar7 != 3.16202013338398e-322; dVar7 = (double)((long)dVar7 + 1)) {
    p[4] = (double)(long)*piVar3;
    p[0] = (double)(RR.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                    m_data + (long)p[4]);
    p[2] = (double)RR.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                   m_cols;
    p[3] = (double)&RR;
    p[5] = 0.0;
    p[6] = 4.94065645841247e-324;
    proots[0] = (double)((long)AM.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                               m_storage.m_data + lVar8);
    proots[2] = (double)AM.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_cols;
    proots[3] = (double)&AM;
    proots[5] = 0.0;
    proots[6] = 4.94065645841247e-324;
    proots[4] = dVar7;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>>
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)proots,
               (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)p);
    piVar3 = piVar3 + 1;
    lVar8 = lVar8 + 8;
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_5608,(DenseStorage<double,__1,__1,__1,_0> *)&AM);
  pdVar4 = p;
  charpoly_danilevsky((MatrixXd *)&local_5608,&pdVar4,
                      (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  uVar1 = local_57a8._0_4_;
  free(local_5608.m_data);
  for (; lVar2 != -1; lVar2 = lVar2 + -1) {
    proots[lVar2] = *pdVar4;
    pdVar4 = pdVar4 + 1;
  }
  find_real_roots_sturm(proots,0x40,roots,&nroots,maxpow,false);
  temp.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0] =
       (double)CONCAT44(temp.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.
                        m_data.array[0]._4_4_,3);
  Eigen::Matrix<std::complex<double>,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<std::complex<double>,_1,_1,0,_1,_1> *)&sols,(int *)&temp,&nroots);
  nroots_00 = nroots;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_5620,(DenseStorage<double,__1,__1,__1,_0> *)&AM);
  solve_xy_from_AM((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    *)&temp,roots,nroots_00,(MatrixXd *)&local_5620);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::_M_move_assign(&v,(RSSinglelinCameraPose *)&temp);
  std::
  _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~_Vector_base((_Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   *)&temp);
  free(local_5620.m_data);
  lVar2 = 0;
  while( true ) {
    if (nroots <= lVar2) break;
    q.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] = 1.0;
    temp.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0] =
         (double)(q.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                  array + 1);
    temp.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[1] =
         1.48219693752374e-323;
    temp.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[4] =
         4.94065645841247e-324;
    temp.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[6] =
         1.97626258336499e-323;
    temp.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[3] =
         (double)&q;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>,Eigen::Matrix<double,3,1,0,3,1>>
              ((Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false> *)&temp,
               v.
               super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar2);
    Eigen::MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::normalize
              ((MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&q);
    local_5538.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
    [2] = q.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2];
    local_5538.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
    [3] = q.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3];
    local_5538.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
    [0] = q.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0];
    local_5538.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
    [1] = q.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1];
    quat2R(&local_5538,&R);
    Eigen::AngleAxis<double>::operator=
              (&eaxn,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&R);
    temp.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[2] =
         eaxn.m_angle;
    temp.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0] =
         (double)&eaxn;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&eax,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                *)&temp);
    temp.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0] =
         (double)CONCAT44(temp.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.
                          m_storage.m_data.array[0]._4_4_,0x12);
    local_55d8 = (RSSinglelinCameraPose *)CONCAT44(local_55d8._4_4_,9);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
              ((Matrix<double,_1,_1,0,_1,_1> *)&A,(int *)&temp,(int *)&local_55d8);
    temp.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0] =
         (double)CONCAT44(temp.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.
                          m_storage.m_data.array[0]._4_4_,0x12);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&b,(int *)&temp);
    lVar8 = 0;
    lVar5 = 0;
    for (lVar6 = 0; lVar6 != 0x90; lVar6 = lVar6 + 0x18) {
      local_57a8._8_8_ = 0;
      local_57a8._0_8_ =
           *(ulong *)((long)(u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                            m_storage.m_data + lVar5 + (long)(int)uVar1 * 8);
      pdVar4 = (local_5798->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
               m_storage.m_data;
      local_5638 = *(undefined8 *)((long)pdVar4 + lVar6);
      local_5630 = *(undefined8 *)((long)pdVar4 + lVar6 + 8);
      local_5628 = *(undefined8 *)((long)pdVar4 + lVar6 + 0x10);
      local_5670 = &local_5638;
      local_5678 = (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&R;
      Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
      _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
                ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_5418,
                 (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                  *)&local_5678);
      X_(&local_5418);
      uVar9 = local_57a8._12_4_;
      dVar7 = local_57a8._0_8_ - r0;
      local_57a8._8_4_ = local_57a8._8_4_;
      local_57a8._0_8_ = dVar7;
      local_57a8._12_4_ = uVar9;
      local_57e0.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_cols
      .m_value = (long)-dVar7;
      local_57e0.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_xpr =
           (XprTypeNested)&local_55d8;
      Eigen::CommaInitializer<Eigen::Matrix<double,3,9,0,3,9>>::
      CommaInitializer<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>>
                ((CommaInitializer<Eigen::Matrix<double,3,9,0,3,9>> *)local_5720,&temp,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                  *)&local_57e0);
      this = Eigen::CommaInitializer<Eigen::Matrix<double,3,9,0,3,9>>::operator_
                       ((CommaInitializer<Eigen::Matrix<double,3,9,0,3,9>> *)local_5720,local_575b);
      Eigen::CommaInitializer<Eigen::Matrix<double,3,9,0,3,9>>::operator_
                ((CommaInitializer<Eigen::Matrix<double,3,9,0,3,9>> *)this,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                  *)&wCt);
      pdVar4 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_data;
      local_5650.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [0] = *(double *)((long)pdVar4 + lVar5);
      local_5650.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [1] = *(double *)((long)pdVar4 + lVar5 + 8);
      local_5650.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2] = 1.0;
      X_(&local_5650);
      local_57e0.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_data
           = (PointerType)
             ((long)A.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                    m_data + lVar6);
      local_57e0.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_rows
      .m_value = 3;
      local_57e0.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_cols
      .m_value = 9;
      local_57e0.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_xpr =
           &A;
      local_57e0.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      m_startCol.m_value = 0;
      local_57e0.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      m_outerStride =
           A.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
      local_57e0.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      m_startRow.m_value = lVar8;
      local_5720 = (undefined1  [8])&local_55d8;
      local_5718 = (RSSinglelinCameraPose *)&temp;
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,9,0,3,9>,0>>
                (&local_57e0,
                 (Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_0>
                  *)local_5720);
      pdVar4 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_data;
      local_5668.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [0] = *(double *)((long)pdVar4 + lVar5);
      local_5668.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [1] = *(double *)((long)pdVar4 + lVar5 + 8);
      local_5668.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2] = 1.0;
      X_(&local_5668);
      pdVar4 = (local_5798->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
               m_storage.m_data;
      wCt.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           *(double **)((long)pdVar4 + lVar6);
      wCt.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           *(Index *)((long)pdVar4 + lVar6 + 8);
      local_5708 = (PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&wCt;
      local_57e0.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_data
           = (PointerType)
             ((long)b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_data + lVar6);
      local_57e0.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_rows
      .m_value = 3;
      local_57e0.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_xpr =
           (XprTypeNested)&b;
      local_57e0.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      m_outerStride =
           b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      local_57e0.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      m_startRow.m_value = lVar8;
      local_5720 = (undefined1  [8])&local_55d8;
      local_5710 = (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&R;
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>>
                ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)&local_57e0,
                 (Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
                  *)local_5720);
      lVar5 = lVar5 + 0x10;
      lVar8 = lVar8 + 3;
    }
    Eigen::HouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    HouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((HouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&temp,
               (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&A);
    local_55d0 = &b;
    local_55d8 = (RSSinglelinCameraPose *)&temp;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Solve<Eigen::HouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&wCt,
               (DenseBase<Eigen::Solve<Eigen::HouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&local_55d8);
    Eigen::HouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~HouseholderQR
              ((HouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&temp);
    temp.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[2] =
         eax.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
    temp.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0] =
         eax.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0];
    temp.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[1] =
         eax.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
    local_55d8 = (RSSinglelinCameraPose *)
                 (wCt.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_data + 3);
    local_55d0 = (VectorXd *)0x3;
    local_55b8 = 3;
    local_55a8 = wCt.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
    ;
    local_55c0 = (PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&wCt;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)
               (temp.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.
                array + 3),
               (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &local_55d8);
    local_57e0.
    super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_data =
         wCt.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    local_57e0.
    super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_rows.
    m_value = 3;
    local_57e0.
    super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_startRow.
    m_value = 0;
    local_57e0.
    super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
    m_outerStride =
         wCt.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_57e0.
    super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_xpr =
         (XprTypeNested)&wCt;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)
               (temp.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.
                array + 6),
               (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &local_57e0);
    local_5720 = (undefined1  [8])
                 (wCt.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_data + 6);
    local_5718 = (RSSinglelinCameraPose *)0x3;
    local_5700 = 6;
    local_56f0 = wCt.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
    ;
    local_5708 = (PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&wCt;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)
               (temp.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.
                array + 9),
               (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               local_5720);
    temp.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0xc] =
         1.0;
    temp.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.array[0xd] =
         0.0;
    std::vector<RSSinglelinCameraPose,_std::allocator<RSSinglelinCameraPose>_>::
    emplace_back<RSSinglelinCameraPose>(results,(RSSinglelinCameraPose *)&temp);
    free(wCt.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    free(b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    free(A.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
    lVar2 = lVar2 + 1;
  }
  free(sols.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,__1,_0,__1,__1>_>.m_storage
       .m_data);
  free(AM.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(RR.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(alpha.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(C1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(C0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  std::
  _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~_Vector_base(&v.
                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 );
  free(CC.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(coeffs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return 0;
}

Assistant:

int r6pSingleLin(const  Eigen::MatrixXd & X, const  Eigen::MatrixXd & u, const Eigen::MatrixXd & ud, int direction, double r0, int maxpow, RSSinglelinCameraPoseVector * results) {
	Eigen::VectorXd coeffs(1260);
	Eigen::MatrixXd CC = Eigen::MatrixXd::Zero(99, 163);

	double solver_input[2475];

	std::vector<Eigen::Vector3d> v;

	if (direction == 0) {
		R6P_cayley_linearized_prepare_data_C(X.data(), u.data(), ud.data(), r0, solver_input);
	}
	else {
		R6P_cayley_linearized_prepare_data_y_C(X.data(), u.data(), ud.data(), r0, solver_input);
	}

	Eigen::Map<Eigen::MatrixXd> data(solver_input, 15, 165);

	for (int j = 0; j < 15; j++)
	{
		data.row(j) /= data.row(j).cwiseAbs().mean();
	}

	computeCoeffs(data, coeffs);
	setupEliminationTemplate(coeffs, CC);

	Eigen::MatrixXd C0 = CC.leftCols(99);
	Eigen::MatrixXd C1 = CC.rightCols(64);
	

	Eigen::MatrixXd alpha = C0.partialPivLu().solve(C1);

	Eigen::MatrixXd RR(85, 64);
	for (int j = 0; j < 21; j++)
	{
		RR.row(j) = -alpha.row(78 + j);
	}


	RR.bottomRows(64) = Eigen::MatrixXd::Identity(64, 64);

	int AM_ind[] = { 78, 55, 40, 32, 28, 0, 1, 2, 31, 3, 4, 33, 5, 38, 37, 6, 7, 39, 8, 41, 42, 43, 9, 51, 49, 48, 10, 11, 50, 12, 52, 53, 54, 13, 56, 57, 58, 59, 14, 73, 69, 66, 65, 15, 16, 67, 68, 17, 70, 71, 72, 18, 74, 75, 76, 77, 19, 79, 80, 81, 82, 83, 84, 20 };
	Eigen::MatrixXd AM(64, 64);
	for (int j = 0; j < 64; j++)
	{
		AM.row(j) = RR.row(AM_ind[j]);
	}

	double p[65];
	charpoly_danilevsky(AM, p);


	int order = 64;
	double proots[65];
	double roots[64];
	int nroots;
	for (int j = 0; j <= order; j++) {
		proots[order - j] = p[j];
	}
	find_real_roots_sturm(proots, order, roots, &nroots, maxpow, 0);


	Eigen::MatrixXcd sols(3, nroots);

	v = solve_xy_from_AM(roots, nroots, AM);


	for (int j = 0; j < nroots; j++)
	{

		Eigen::Matrix3d R;
		Eigen::Vector4d q;
		q(0) = 1;
		q.segment(1, 3) = v[j];
		q.normalize();
		quat2R(q, R);

		Eigen::AngleAxis<double> eaxn = Eigen::AngleAxis<double>(R);

		Eigen::Vector3d eax = eaxn.axis()*eaxn.angle();
		//std::cout << R;
		Eigen::MatrixXd A(18, 9);
		Eigen::VectorXd b(18);
		for (int k = 0; k < 6; k++)
		{
			double dr = u(k * 2 + direction) - r0;
			Eigen::Matrix<double, 3, 9> temp;
			temp << -dr*X_(R*Eigen::Vector3d(X(k * 3), X(k * 3 + 1), X(k * 3 + 2))), Eigen::Matrix3d::Identity(), dr*Eigen::Matrix3d::Identity();

			A.block(k * 3, 0, 3, 9) = X_(Eigen::Vector3d(u(k * 2), u(k * 2 + 1), 1))*temp;

			b.segment(k * 3, 3) = -X_(Eigen::Vector3d(u(k * 2), u(k * 2 + 1), 1))*R*Eigen::Vector3d(X(k * 3), X(k * 3 + 1), X(k * 3 + 2));

		}

		Eigen::VectorXd wCt = A.householderQr().solve(b);


		results->push_back({eax, wCt.segment(3,3), wCt.segment(0,3), wCt.segment(6,3), 1, 0});

	}


	return 0;

}